

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  size_t sVar3;
  FindInfo FVar4;
  Layout LVar5;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar3 = 0;
      do {
        if (-1 < p[sVar3]) {
          auVar2 = ZEXT416(psVar1[sVar3].value.first._data) * ZEXT816(0xde5fb9d2630458e9);
          hashval = auVar2._8_8_ + auVar2._0_8_;
          FVar4 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar4.offset,(byte)hashval & 0x7f);
          this->slots_[FVar4.offset] = psVar1[sVar3];
        }
        sVar3 = sVar3 + 1;
      } while (capacity != sVar3);
      LVar5 = MakeLayout(capacity);
      Deallocate<4ul,std::allocator<std::pair<Key<3ul>const,unsigned_int>>>
                ((allocator<std::pair<const_Key<3UL>,_unsigned_int>_> *)&this->settings_,p,
                 (LVar5.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<Key<3UL>,_unsigned_int>_>
                  .size_[0] + 3 & 0xfffffffffffffffc) +
                 LVar5.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<Key<3UL>,_unsigned_int>_>
                 .size_[1] * 8);
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3>, unsigned int>, Key<3>::Hash, phmap::EqualTo<Key<3>>, std::allocator<std::pair<const Key<3>, unsigned int>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<Key<3>, unsigned int>, Hash = Key<3>::Hash, Eq = phmap::EqualTo<Key<3>>, Alloc = std::allocator<std::pair<const Key<3>, unsigned int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }